

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int vdbePmaReadBlob(PmaReader *p,int nByte,u8 **ppOut)

{
  int iVar1;
  int iVar2;
  int iVar3;
  void *pvVar4;
  int iVar5;
  long *in_RDX;
  int in_ESI;
  long *in_RDI;
  u8 *aNext;
  int nCopy;
  int rc_1;
  int nNew;
  u8 *aNew;
  int nRem;
  int rc;
  int nRead;
  int nAvail;
  int iBuf;
  i64 in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffffa4;
  void *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  undefined4 in_stack_ffffffffffffffb8;
  int local_34;
  undefined4 in_stack_ffffffffffffffe8;
  int local_4;
  
  if (in_RDI[8] == 0) {
    iVar1 = (int)(*in_RDI % (long)(int)in_RDI[7]);
    if ((iVar1 != 0) ||
       (local_4 = sqlite3OsRead((sqlite3_file *)
                                CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                                in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,
                                in_stack_ffffffffffffff98), local_4 == 0)) {
      iVar2 = (int)in_RDI[7] - iVar1;
      if (iVar2 < in_ESI) {
        if ((int)in_RDI[2] < in_ESI) {
          iVar5 = (int)in_RDI[2] * 2;
          if (iVar5 == 0x80 || SBORROW4(0x80,iVar5) != (int)in_RDI[2] * -2 + 0x80 < 0) {
            iVar5 = (int)in_RDI[2] << 1;
          }
          else {
            iVar5 = 0x80;
          }
          for (; iVar5 < in_ESI; iVar5 = iVar5 << 1) {
          }
          pvVar4 = sqlite3Realloc((void *)CONCAT44(iVar5,in_stack_ffffffffffffffb8),
                                  CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
          if (pvVar4 == (void *)0x0) {
            return 7;
          }
          *(int *)(in_RDI + 2) = iVar5;
          in_RDI[4] = (long)pvVar4;
        }
        memcpy((void *)in_RDI[4],(void *)(in_RDI[6] + (long)iVar1),(long)iVar2);
        *in_RDI = (long)iVar2 + *in_RDI;
        for (local_34 = in_ESI - iVar2; 0 < local_34; local_34 = local_34 - iVar5) {
          iVar5 = local_34;
          if ((int)in_RDI[7] < local_34) {
            iVar5 = (int)in_RDI[7];
          }
          iVar3 = vdbePmaReadBlob((PmaReader *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
                                  (int)((ulong)in_RDX >> 0x20),(u8 **)CONCAT44(iVar1,iVar2));
          if (iVar3 != 0) {
            return iVar3;
          }
          memcpy((void *)(in_RDI[4] + (long)(in_ESI - local_34)),in_stack_ffffffffffffffa8,
                 (long)iVar5);
        }
        *in_RDX = in_RDI[4];
      }
      else {
        *in_RDX = in_RDI[6] + (long)iVar1;
        *in_RDI = (long)in_ESI + *in_RDI;
      }
      local_4 = 0;
    }
  }
  else {
    *in_RDX = in_RDI[8] + *in_RDI;
    *in_RDI = (long)in_ESI + *in_RDI;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int vdbePmaReadBlob(
  PmaReader *p,                   /* PmaReader from which to take the blob */
  int nByte,                      /* Bytes of data to read */
  u8 **ppOut                      /* OUT: Pointer to buffer containing data */
){
  int iBuf;                       /* Offset within buffer to read from */
  int nAvail;                     /* Bytes of data available in buffer */

  if( p->aMap ){
    *ppOut = &p->aMap[p->iReadOff];
    p->iReadOff += nByte;
    return SQLITE_OK;
  }

  assert( p->aBuffer );

  /* If there is no more data to be read from the buffer, read the next 
  ** p->nBuffer bytes of data from the file into it. Or, if there are less
  ** than p->nBuffer bytes remaining in the PMA, read all remaining data.  */
  iBuf = p->iReadOff % p->nBuffer;
  if( iBuf==0 ){
    int nRead;                    /* Bytes to read from disk */
    int rc;                       /* sqlite3OsRead() return code */

    /* Determine how many bytes of data to read. */
    if( (p->iEof - p->iReadOff) > (i64)p->nBuffer ){
      nRead = p->nBuffer;
    }else{
      nRead = (int)(p->iEof - p->iReadOff);
    }
    assert( nRead>0 );

    /* Readr data from the file. Return early if an error occurs. */
    rc = sqlite3OsRead(p->pFd, p->aBuffer, nRead, p->iReadOff);
    assert( rc!=SQLITE_IOERR_SHORT_READ );
    if( rc!=SQLITE_OK ) return rc;
  }
  nAvail = p->nBuffer - iBuf; 

  if( nByte<=nAvail ){
    /* The requested data is available in the in-memory buffer. In this
    ** case there is no need to make a copy of the data, just return a 
    ** pointer into the buffer to the caller.  */
    *ppOut = &p->aBuffer[iBuf];
    p->iReadOff += nByte;
  }else{
    /* The requested data is not all available in the in-memory buffer.
    ** In this case, allocate space at p->aAlloc[] to copy the requested
    ** range into. Then return a copy of pointer p->aAlloc to the caller.  */
    int nRem;                     /* Bytes remaining to copy */

    /* Extend the p->aAlloc[] allocation if required. */
    if( p->nAlloc<nByte ){
      u8 *aNew;
      int nNew = MAX(128, p->nAlloc*2);
      while( nByte>nNew ) nNew = nNew*2;
      aNew = sqlite3Realloc(p->aAlloc, nNew);
      if( !aNew ) return SQLITE_NOMEM_BKPT;
      p->nAlloc = nNew;
      p->aAlloc = aNew;
    }

    /* Copy as much data as is available in the buffer into the start of
    ** p->aAlloc[].  */
    memcpy(p->aAlloc, &p->aBuffer[iBuf], nAvail);
    p->iReadOff += nAvail;
    nRem = nByte - nAvail;

    /* The following loop copies up to p->nBuffer bytes per iteration into
    ** the p->aAlloc[] buffer.  */
    while( nRem>0 ){
      int rc;                     /* vdbePmaReadBlob() return code */
      int nCopy;                  /* Number of bytes to copy */
      u8 *aNext;                  /* Pointer to buffer to copy data from */

      nCopy = nRem;
      if( nRem>p->nBuffer ) nCopy = p->nBuffer;
      rc = vdbePmaReadBlob(p, nCopy, &aNext);
      if( rc!=SQLITE_OK ) return rc;
      assert( aNext!=p->aAlloc );
      memcpy(&p->aAlloc[nByte - nRem], aNext, nCopy);
      nRem -= nCopy;
    }

    *ppOut = p->aAlloc;
  }

  return SQLITE_OK;
}